

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_cs_derived.cpp
# Opt level: O1

ir_variable * __thiscall
anon_unknown.dwarf_51e48::lower_cs_derived_visitor::add_system_value
          (lower_cs_derived_visitor *this,int slot,glsl_type *type,char *name)

{
  exec_node *peVar1;
  exec_list *peVar2;
  exec_node *peVar3;
  ir_variable *this_00;
  
  this_00 = (ir_variable *)exec_node::operator_new(0x90,this->shader);
  ir_variable::ir_variable(this_00,type,name,ir_var_system_value);
  (this_00->data).location = slot;
  *(uint *)&this_00->data = *(uint *)&this_00->data & 0xfff3f3fe | 0x40801;
  peVar2 = this->shader->ir;
  peVar1 = &(this_00->super_ir_instruction).super_exec_node;
  peVar3 = (peVar2->head_sentinel).next;
  (this_00->super_ir_instruction).super_exec_node.next = peVar3;
  (this_00->super_ir_instruction).super_exec_node.prev = &peVar2->head_sentinel;
  peVar3->prev = peVar1;
  (peVar2->head_sentinel).next = peVar1;
  return this_00;
}

Assistant:

ir_variable *
lower_cs_derived_visitor::add_system_value(
      int slot, const glsl_type *type, const char *name)
{
   ir_variable *var = new(shader) ir_variable(type, name, ir_var_system_value);
   var->data.how_declared = ir_var_declared_implicitly;
   var->data.read_only = true;
   var->data.location = slot;
   var->data.explicit_location = true;
   var->data.explicit_index = 0;
   shader->ir->push_head(var);

   return var;
}